

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UpnpStateVarComplete.c
# Opt level: O0

void UpnpStateVarComplete_delete(UpnpStateVarComplete *q)

{
  s_UpnpStateVarComplete *p;
  UpnpStateVarComplete *q_local;
  
  if (q != (UpnpStateVarComplete *)0x0) {
    ixmlFreeDOMString(q->m_CurrentVal);
    q->m_CurrentVal = (char *)0x0;
    UpnpString_delete(q->m_StateVarName);
    q->m_StateVarName = (UpnpString *)0x0;
    UpnpString_delete(q->m_CtrlUrl);
    q->m_CtrlUrl = (UpnpString *)0x0;
    q->m_ErrCode = 0;
    free(q);
  }
  return;
}

Assistant:

void UpnpStateVarComplete_delete(UpnpStateVarComplete *q)
{
	struct s_UpnpStateVarComplete *p = (struct s_UpnpStateVarComplete *)q;

	if (!p)
		return;

	ixmlFreeDOMString(p->m_CurrentVal);
	p->m_CurrentVal = 0;
	UpnpString_delete(p->m_StateVarName);
	p->m_StateVarName = 0;
	UpnpString_delete(p->m_CtrlUrl);
	p->m_CtrlUrl = 0;
	p->m_ErrCode = 0;

	free(p);
}